

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarType.cpp
# Opt level: O1

bool __thiscall
glu::VariableDeclaration::operator==(VariableDeclaration *this,VariableDeclaration *other)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  
  bVar1 = Layout::operator==(&this->layout,&other->layout);
  if ((((bVar1) && (this->interpolation == other->interpolation)) &&
      (this->storage == other->storage)) &&
     (((bVar1 = glu::VarType::operator==(&this->varType,&other->varType), bVar1 &&
       (this->memoryAccessQualifierBits == other->memoryAccessQualifierBits)) &&
      (__n = (this->name)._M_string_length, __n == (other->name)._M_string_length)))) {
    if (__n != 0) {
      iVar2 = bcmp((this->name)._M_dataplus._M_p,(other->name)._M_dataplus._M_p,__n);
      return iVar2 == 0;
    }
    return true;
  }
  return false;
}

Assistant:

bool VariableDeclaration::operator== (const VariableDeclaration& other) const
{
	return	layout == other.layout &&
			interpolation == other.interpolation &&
			storage == other.storage &&
			varType == other.varType &&
			memoryAccessQualifierBits == other.memoryAccessQualifierBits &&
			name == other.name;
}